

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plf_stack.h
# Opt level: O3

void __thiscall
plf::stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>::push
          (stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_> *this,
          MatchingStateDebugFailures *element)

{
  size_t sVar1;
  size_t sVar2;
  unsigned_long uVar3;
  group_pointer_type this_00;
  MatchingStateDebugFailures *pMVar4;
  group_pointer_type pgVar5;
  char cVar6;
  element_pointer_type pMVar7;
  ulong __n;
  
  pMVar7 = this->top_element;
  cVar6 = (pMVar7 == this->end_element) + (pMVar7 == (element_pointer_type)0x0);
  if (cVar6 == '\x02') {
    initialize(this);
    pMVar7 = this->top_element;
    pMVar7->Failures = element->Failures;
    sVar1 = (element->super_MatchingState).InPos;
    sVar2 = (element->super_MatchingState).ContainsPos;
    uVar3 = (element->super_MatchingState).LastMatched.second;
    (pMVar7->super_MatchingState).LastMatched.first =
         (element->super_MatchingState).LastMatched.first;
    (pMVar7->super_MatchingState).LastMatched.second = uVar3;
    (pMVar7->super_MatchingState).InPos = sVar1;
    (pMVar7->super_MatchingState).ContainsPos = sVar2;
  }
  else if (cVar6 == '\x01') {
    pgVar5 = this->current_group->next_group;
    if (pgVar5 == (group_pointer_type)0x0) {
      this_00 = (group_pointer_type)operator_new(0x20);
      this->current_group->next_group = this_00;
      pgVar5 = this->current_group;
      __n = (this->group_allocator_pair).max_block_capacity;
      if (this->total_number_of_elements < __n) {
        __n = this->total_number_of_elements;
      }
      if (pgVar5 == (group_pointer_type)0x0) {
        pMVar7 = (element_pointer_type)0x0;
      }
      else {
        pMVar7 = pgVar5->elements;
      }
      pMVar4 = __gnu_cxx::new_allocator<MatchingStateDebugFailures>::allocate
                         ((new_allocator<MatchingStateDebugFailures> *)this_00,__n,pMVar7);
      this_00->elements = pMVar4;
      this_00->next_group = (group_pointer_type)0x0;
      this_00->previous_group = pgVar5;
      this_00->end = pMVar4 + (__n - 1);
      pgVar5 = this->current_group->next_group;
    }
    this->current_group = pgVar5;
    pMVar7 = pgVar5->elements;
    this->top_element = pMVar7;
    this->start_element = pMVar7;
    pMVar7->Failures = element->Failures;
    sVar1 = (element->super_MatchingState).InPos;
    sVar2 = (element->super_MatchingState).ContainsPos;
    uVar3 = (element->super_MatchingState).LastMatched.second;
    (pMVar7->super_MatchingState).LastMatched.first =
         (element->super_MatchingState).LastMatched.first;
    (pMVar7->super_MatchingState).LastMatched.second = uVar3;
    (pMVar7->super_MatchingState).InPos = sVar1;
    (pMVar7->super_MatchingState).ContainsPos = sVar2;
    this->end_element = this->current_group->end;
  }
  else {
    this->top_element = pMVar7 + 1;
    pMVar7[1].Failures = element->Failures;
    sVar1 = (element->super_MatchingState).InPos;
    sVar2 = (element->super_MatchingState).ContainsPos;
    uVar3 = (element->super_MatchingState).LastMatched.second;
    pMVar7[1].super_MatchingState.LastMatched.first =
         (element->super_MatchingState).LastMatched.first;
    pMVar7[1].super_MatchingState.LastMatched.second = uVar3;
    pMVar7[1].super_MatchingState.InPos = sVar1;
    pMVar7[1].super_MatchingState.ContainsPos = sVar2;
  }
  this->total_number_of_elements = this->total_number_of_elements + 1;
  return;
}

Assistant:

void push(element_type &&element)
		{
			switch ((top_element == NULL) + (top_element == end_element))
			{
				case 0:
				{
					#ifdef PLF_TYPE_TRAITS_SUPPORT
						if PLF_CONSTEXPR (std::is_nothrow_move_constructible<element_type>::value)
						{
							PLF_CONSTRUCT(element_allocator_type, *this, ++top_element, std::move(element));
						}
						else
					#endif
					{
						try
						{
							PLF_CONSTRUCT(element_allocator_type, *this, ++top_element, std::move(element));
						}
						catch (...)
						{
							--top_element;
							throw;
						}
					}

					++total_number_of_elements;
					return;
				}
				case 1:
				{
					if (current_group->next_group == NULL)
					{
						current_group->next_group = PLF_ALLOCATE(group_allocator_type, group_allocator_pair, 1, current_group);

						try
						{
							#ifdef PLF_VARIADICS_SUPPORT
								PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, current_group->next_group, (total_number_of_elements < group_allocator_pair.max_block_capacity) ? total_number_of_elements : group_allocator_pair.max_block_capacity, current_group);
							#else
								PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, current_group->next_group, group((total_number_of_elements < group_allocator_pair.max_block_capacity) ? total_number_of_elements : group_allocator_pair.max_block_capacity, current_group));
							#endif
						}
						catch (...)
						{
							PLF_DEALLOCATE(group_allocator_type, group_allocator_pair, current_group->next_group, 1);
							current_group->next_group = NULL;
							throw;
						}
					}

					current_group = current_group->next_group;
					start_element = top_element = current_group->elements;

					#ifdef PLF_TYPE_TRAITS_SUPPORT
						if PLF_CONSTEXPR (std::is_nothrow_move_constructible<element_type>::value)
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						else
					#endif
					{
						try
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						catch (...)
						{
							current_group = current_group->previous_group;
							start_element = current_group->elements;
							top_element = current_group->end;
							throw;
						}
					}


					end_element = current_group->end;
					++total_number_of_elements;
					return;
				}
				case 2: // ie. empty stack, must initialize
				{
					initialize();

					#ifdef PLF_TYPE_TRAITS_SUPPORT
						if PLF_CONSTEXPR (std::is_nothrow_move_constructible<element_type>::value)
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						else
					#endif
					{
						try
						{
							PLF_CONSTRUCT(element_allocator_type, *this, top_element, std::move(element));
						}
						catch (...)
						{
							clear();
							throw;
						}
					}


					++total_number_of_elements;
					return;
				}
			}
		}